

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O0

int ImpactGenerator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  bool bVar1;
  int iVar2;
  EffectData *pEVar3;
  ImpactInstance *random;
  Impact *pIVar4;
  uint uVar5;
  Impact *pIVar6;
  float fVar7;
  int local_84;
  int c;
  float impact;
  uint n;
  Impact *imp_1;
  undefined1 auStack_68 [4];
  int i;
  Impact imp;
  float thr;
  float gain;
  ImpactInstance *instance;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<ImpactGenerator::EffectData>(state);
  memset(outbuffer,0,(ulong)length * 4 * (long)outchannels);
  random = GetImpactInstance((int)pEVar3->p[0]);
  if (random != (ImpactInstance *)0x0) {
    imp.bw = powf(10.0,pEVar3->p[1] * 0.05);
    imp.cut = powf(10.0,pEVar3->p[2] * 0.05);
    while (bVar1 = RingBuffer<1000,_ImpactGenerator::Impact>::Read
                             (&random->impactrb,(Impact *)auStack_68), bVar1) {
      if (random->numimpacts < random->maximpacts) {
        iVar2 = random->numimpacts;
        random->numimpacts = iVar2 + 1;
        pIVar4 = random->impacts + iVar2;
        pIVar4->volume = (float)auStack_68;
        pIVar4->decay = (float)i;
        pIVar4->lpf = imp.volume;
        pIVar4->bpf = imp.decay;
        pIVar4->cut = imp.lpf;
        pIVar4->bw = imp.bpf;
      }
    }
    imp_1._4_4_ = 0;
    while (imp_1._4_4_ < random->numimpacts) {
      pIVar4 = random->impacts + imp_1._4_4_;
      for (c = 0; (uint)c < length; c = c + 1) {
        fVar7 = Impact::Process(pIVar4,&random->random);
        for (local_84 = 0; local_84 < inchannels; local_84 = local_84 + 1) {
          uVar5 = c * inchannels + local_84;
          outbuffer[uVar5] = fVar7 * imp.bw + outbuffer[uVar5];
        }
      }
      if (imp.cut <= pIVar4->volume) {
        imp_1._4_4_ = imp_1._4_4_ + 1;
      }
      else {
        iVar2 = random->numimpacts + -1;
        random->numimpacts = iVar2;
        pIVar6 = random->impacts + iVar2;
        fVar7 = pIVar6->decay;
        pIVar4->volume = pIVar6->volume;
        pIVar4->decay = fVar7;
        fVar7 = pIVar6->bpf;
        pIVar4->lpf = pIVar6->lpf;
        pIVar4->bpf = fVar7;
        fVar7 = pIVar6->bw;
        pIVar4->cut = pIVar6->cut;
        pIVar4->bw = fVar7;
      }
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memset(outbuffer, 0, sizeof(float) * length * outchannels);

        ImpactInstance* instance = GetImpactInstance((int)data->p[P_INSTANCE]);
        if (instance == NULL)
            return UNITY_AUDIODSP_OK;

        float gain = powf(10.0f, data->p[P_GAIN] * 0.05f);
        float thr = powf(10.0f, data->p[P_THR] * 0.05f);

        Impact imp;
        while (instance->impactrb.Read(imp))
            if (instance->numimpacts < instance->maximpacts)
                instance->impacts[instance->numimpacts++] = imp;

        int i = 0;
        while (i < instance->numimpacts)
        {
            Impact& imp = instance->impacts[i];
            for (unsigned int n = 0; n < length; n++)
            {
                float impact = imp.Process(instance->random) * gain;
                for (int c = 0; c < inchannels; c++)
                    outbuffer[n * inchannels + c] += impact;
            }
            if (imp.volume < thr)
                imp = instance->impacts[--instance->numimpacts];
            else
                ++i;
        }

        return UNITY_AUDIODSP_OK;
    }